

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O0

void ast::Sections::binary_logisim16(char *file_name,uint lower_address,uint higher_address)

{
  uint16_t uVar1;
  uint16_t uVar2;
  ostream *this;
  bool bVar3;
  failure *e;
  uint j;
  uint16_t c;
  uint address;
  ostream local_218 [8];
  ofstream file;
  uint higher_address_local;
  uint lower_address_local;
  char *file_name_local;
  
  std::ofstream::ofstream(local_218,file_name,0x10);
  this = std::operator<<(local_218,"v2.0 raw");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  j = lower_address;
  while (j < higher_address) {
    uVar1 = Memory_space::read16((Memory_space *)memory,j);
    uVar2 = Memory_space::read16((Memory_space *)memory,j + 2);
    if (uVar2 == uVar1) {
      e._0_4_ = 2;
      j = j + 4;
      while( true ) {
        bVar3 = false;
        if (j < higher_address) {
          uVar2 = Memory_space::read16((Memory_space *)memory,j);
          bVar3 = uVar1 == uVar2;
        }
        if (!bVar3) break;
        j = j + 2;
        e._0_4_ = (uint)e + 1;
      }
      ostream_printf(local_218," %d*%04x",(ulong)(uint)e,(ulong)uVar1);
    }
    else {
      ostream_printf(local_218," %04x",(ulong)uVar1);
      j = j + 2;
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void Sections::binary_logisim16(const char *file_name, unsigned lower_address, unsigned higher_address) {
	try {
		std::ofstream file(file_name);
		file << "v2.0 raw" << endl;
		for (auto address = lower_address; address < higher_address; ) {
			auto c = memory.read16(address);
			address += 2;
			//	Quantas palavras iguais a esta?
			if (memory.read16(address) == c) {
				auto j = 2U;
				for (address += 2;
				     	address < higher_address && c == memory.read16(address);
					 		address += 2, j++)
					;
				ostream_printf(file, " %d*%04x", j, static_cast<uint16_t >(c));
			}
			else
				ostream_printf(file, " %04x", static_cast<uint16_t >(c));
		}
		file.close();
	} catch (ios_base::failure &e) {
		cerr << e.what();
	}
}